

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall
cs::compiler_type::build_tree
          (compiler_type *this,tree_type<cs::token_base_*> *tree,
          deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *signals,
          deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *objects)

{
  _Elt_pointer pptVar1;
  _Elt_pointer pptVar2;
  _Map_pointer ppptVar3;
  _Map_pointer ppptVar4;
  tree_type<cs::token_base_*> *ptVar5;
  undefined8 it_00;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *pdVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  token_base *ptVar10;
  undefined4 extraout_var;
  iterator iVar11;
  reference pptVar12;
  iterator iVar13;
  token_base **pptVar14;
  compile_error *this_00;
  _Elt_pointer pptVar15;
  tree_type<cs::token_base_*> *ptVar16;
  _Elt_pointer pptVar17;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *list;
  _func_int **pp_Var18;
  _Map_pointer ppptVar19;
  tree_type<cs::token_base_*> *ptVar20;
  _func_int *p_Var21;
  size_t i;
  ulong __n;
  token_base **it;
  tree_type<cs::token_base_*> *__args;
  tree_type<cs::token_base_*> t;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> tokens;
  tree_type<cs::token_base_*> local_e0;
  undefined1 local_d8 [16];
  tree_node local_c8;
  _Elt_pointer local_a8;
  _Elt_pointer pptStack_a0;
  _Elt_pointer local_98;
  _Map_pointer ppptStack_90;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *local_88;
  _Elt_pointer local_80;
  _Map_pointer local_78;
  _Elt_pointer local_70;
  _Elt_pointer local_68;
  size_t local_60;
  compiler_type *local_58;
  _func_int **local_50;
  _func_int **local_48;
  tree_node *local_40;
  _func_int **local_38;
  
  pptVar15 = (objects->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
             _M_impl.super__Deque_impl_data._M_start._M_cur;
  pptVar17 = (objects->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pptVar17 != pptVar15) {
    pptVar1 = (signals->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
              _M_impl.super__Deque_impl_data._M_start._M_cur;
    pptVar2 = (signals->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pptVar2 != pptVar1) {
      ppptVar3 = (objects->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_finish._M_node;
      local_68 = (objects->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_start._M_last;
      ppptVar19 = (objects->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                  _M_impl.super__Deque_impl_data._M_start._M_node;
      ppptVar4 = (signals->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_finish._M_node;
      if (((long)local_68 - (long)pptVar15 >> 3) +
          ((long)pptVar17 -
           (long)(objects->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
          ((((ulong)((long)ppptVar3 - (long)ppptVar19) >> 3) - 1) +
          (ulong)(ppptVar3 == (_Map_pointer)0x0)) * 0x40 ==
          ((long)pptVar2 -
           (long)(signals->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
          ((((ulong)((long)ppptVar4 -
                    (long)(signals->
                          super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                          _M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
          (ulong)(ppptVar4 == (_Map_pointer)0x0)) * 0x40 +
          ((long)(signals->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_start._M_last - (long)pptVar1 >> 3) + 1) {
        local_88 = objects;
        if (pptVar15 != pptVar17) {
          local_48 = (_func_int **)&PTR__token_expr_00336520;
          local_40 = (tree_node *)&PTR__token_base_00336430;
          local_80 = pptVar17;
          local_58 = this;
          do {
            if ((*pptVar15 != (token_base *)0x0) &&
               (iVar8 = (*(*pptVar15)->_vptr_token_base[2])(), iVar8 == 9)) {
              ptVar10 = *pptVar15;
              local_98 = (_Elt_pointer)0x0;
              ppptStack_90 = (_Map_pointer)0x0;
              local_a8 = (_Elt_pointer)0x0;
              pptStack_a0 = (_Elt_pointer)0x0;
              local_c8.right = (tree_node *)0x0;
              local_c8.data = (token_base *)0x0;
              local_c8.root = (tree_node *)0x0;
              local_c8.left = (tree_node *)0x0;
              local_d8._0_8_ = (tree_node *)0x0;
              local_d8._8_8_ = 0;
              ptVar20 = (tree_type<cs::token_base_*> *)0x0;
              local_78 = ppptVar19;
              local_70 = pptVar15;
              std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::
              _M_initialize_map((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                                local_d8,0);
              pp_Var18 = ptVar10[2]._vptr_token_base;
              local_38 = ptVar10[4]._vptr_token_base;
              if (pp_Var18 != local_38) {
                local_50 = ptVar10[3]._vptr_token_base;
                local_60 = ptVar10[3].line_num;
                do {
                  __args = (tree_type<cs::token_base_*> *)pp_Var18[2];
                  ptVar5 = (tree_type<cs::token_base_*> *)pp_Var18[6];
                  if (__args != ptVar5) {
                    ptVar16 = (tree_type<cs::token_base_*> *)pp_Var18[4];
                    p_Var21 = pp_Var18[5];
                    do {
                      if (local_a8 == local_98 + -1) {
                        ptVar20 = __args;
                        std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
                        _M_push_back_aux<cs::token_base*const&>
                                  ((deque<cs::token_base*,std::allocator<cs::token_base*>> *)
                                   local_d8,(token_base **)__args);
                      }
                      else {
                        *local_a8 = (token_base *)__args->mRoot;
                        local_a8 = local_a8 + 1;
                      }
                      __args = __args + 1;
                      if (__args == ptVar16) {
                        __args = *(tree_type<cs::token_base_*> **)(p_Var21 + 8);
                        p_Var21 = p_Var21 + 8;
                        ptVar16 = __args + 0x40;
                      }
                    } while (__args != ptVar5);
                  }
                  local_e0.mRoot =
                       (tree_node *)token_base::operator_new((token_base *)0x18,(size_t)ptVar20);
                  (local_e0.mRoot)->left = (tree_node *)0x1;
                  (local_e0.mRoot)->root = local_40;
                  *(undefined4 *)&(local_e0.mRoot)->right = 0xd;
                  if (local_a8 == local_98 + -1) {
                    ptVar20 = &local_e0;
                    std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
                    _M_push_back_aux<cs::token_base*>
                              ((deque<cs::token_base*,std::allocator<cs::token_base*>> *)local_d8,
                               (token_base **)ptVar20);
                  }
                  else {
                    *local_a8 = (token_base *)local_e0.mRoot;
                    local_a8 = local_a8 + 1;
                  }
                  pp_Var18 = pp_Var18 + 10;
                  if (pp_Var18 == local_50) {
                    pp_Var18 = *(_func_int ***)(local_60 + 8);
                    local_60 = local_60 + 8;
                    local_50 = pp_Var18 + 0x3c;
                  }
                  this = local_58;
                } while (pp_Var18 != local_38);
              }
              if (local_a8 == pptStack_a0) {
                operator_delete(pptStack_a0,0x200);
                pptStack_a0 = ppptStack_90[-1];
                local_98 = pptStack_a0 + 0x40;
                local_a8 = pptStack_a0 + 0x3f;
                ppptStack_90 = ppptStack_90 + -1;
              }
              else {
                local_a8 = local_a8 + -1;
              }
              pptVar15 = local_70;
              ppptVar19 = local_78;
              pptVar17 = local_80;
              local_e0.mRoot = (tree_node *)0x0;
              ptVar20 = &local_e0;
              gen_tree(this,ptVar20,
                       (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)local_d8);
              ptVar10 = (token_base *)token_base::operator_new((token_base *)0x18,(size_t)ptVar20);
              iVar8 = tree_type<cs::token_base_*>::copy
                                ((EVP_PKEY_CTX *)local_e0.mRoot,(EVP_PKEY_CTX *)0x0);
              ptVar10->line_num = 1;
              ptVar10->_vptr_token_base = local_48;
              ptVar10[1]._vptr_token_base = (_func_int **)CONCAT44(extraout_var,iVar8);
              *pptVar15 = ptVar10;
              tree_type<cs::token_base_*>::destroy((tree_node *)0x0);
              tree_type<cs::token_base_*>::destroy(local_e0.mRoot);
              std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
                        ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                         local_d8);
            }
            pptVar15 = pptVar15 + 1;
            if (pptVar15 == local_68) {
              pptVar15 = ppptVar19[1];
              ppptVar19 = ppptVar19 + 1;
              local_68 = pptVar15 + 0x40;
            }
          } while (pptVar15 != pptVar17);
        }
        tree_type<cs::token_base_*>::destroy(tree->mRoot);
        tree->mRoot = (tree_node *)0x0;
        tree_type<cs::token_base*>::emplace_root_left<cs::token_base*&>
                  ((tree_type<cs::token_base*> *)tree,(iterator)0x0,
                   (signals->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)
                   ._M_impl.super__Deque_impl_data._M_start._M_cur);
        tree_type<cs::token_base*>::emplace_left_left<cs::token_base*&>
                  ((tree_type<cs::token_base*> *)tree,tree->mRoot,
                   (local_88->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>
                   )._M_impl.super__Deque_impl_data._M_start._M_cur);
        __n = 1;
        do {
          pdVar6 = local_88;
          ppptVar3 = (signals->
                     super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl
                     .super__Deque_impl_data._M_finish._M_node;
          if (((long)(signals->
                     super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl
                     .super__Deque_impl_data._M_start._M_last -
               (long)(signals->
                     super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl
                     .super__Deque_impl_data._M_start._M_cur >> 3) +
              ((long)(signals->
                     super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl
                     .super__Deque_impl_data._M_finish._M_cur -
               (long)(signals->
                     super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl
                     .super__Deque_impl_data._M_finish._M_first >> 3) +
              ((((ulong)((long)ppptVar3 -
                        (long)(signals->
                              super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>
                              )._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
              (ulong)(ppptVar3 == (_Map_pointer)0x0)) * 0x40 <= __n) {
            local_d8._0_8_ = tree->mRoot;
            if ((tree_node *)local_d8._0_8_ != (tree_node *)0x0) {
              do {
                iVar11 = tree_type<cs::token_base_*>::iterator::right((iterator *)local_d8);
                if (iVar11.mData == (tree_node *)0x0) {
                  pptVar15 = (pdVar6->
                             super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)
                             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
                  if (pptVar15 ==
                      (pdVar6->
                      super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                      _M_impl.super__Deque_impl_data._M_finish._M_first) {
                    pptVar15 = (pdVar6->
                               super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>
                               )._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
                  }
                  tree_type<cs::token_base*>::emplace_right_right<cs::token_base*&>
                            ((tree_type<cs::token_base*> *)tree,(iterator)local_d8._0_8_,
                             pptVar15 + -1);
                  return;
                }
                local_d8._0_8_ = tree_type<cs::token_base_*>::iterator::right((iterator *)local_d8);
              } while ((tree_node *)local_d8._0_8_ != (tree_node *)0x0);
            }
            return;
          }
          local_d8._0_8_ = tree->mRoot;
          while ((tree_node *)local_d8._0_8_ != (tree_node *)0x0) {
            iVar11 = tree_type<cs::token_base_*>::iterator::right((iterator *)local_d8);
            it_00 = local_d8._0_8_;
            if (iVar11.mData == (tree_node *)0x0) {
              pptVar12 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                                   (local_88,__n);
              tree_type<cs::token_base*>::emplace_right_right<cs::token_base*&>
                        ((tree_type<cs::token_base*> *)tree,(iterator)it_00,pptVar12);
              break;
            }
            local_d8._0_8_ = tree_type<cs::token_base_*>::iterator::right((iterator *)local_d8);
          }
          local_d8._0_8_ = tree->mRoot;
          while ((tree_node *)local_d8._0_8_ != (tree_node *)0x0) {
            iVar13 = tree_type<cs::token_base_*>::iterator::right((iterator *)local_d8);
            iVar11.mData = (tree_node *)local_d8._0_8_;
            if (iVar13.mData == (tree_node *)0x0) {
              pptVar14 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                                   (signals,__n);
LAB_002b2891:
              tree_type<cs::token_base*>::emplace_root_left<cs::token_base*&>
                        ((tree_type<cs::token_base*> *)tree,iVar11,pptVar14);
              break;
            }
            pptVar14 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_d8);
            iVar8 = get_signal_level(this,*pptVar14);
            pptVar12 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                                 (signals,__n);
            iVar9 = get_signal_level(this,*pptVar12);
            pptVar14 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_d8);
            if (iVar8 == iVar9) {
              bVar7 = is_left_associative(this,*pptVar14);
              iVar11.mData = (tree_node *)local_d8._0_8_;
              pptVar14 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                                   (signals,__n);
              if (!bVar7) goto LAB_002b2891;
              tree_type<cs::token_base*>::emplace_right_left<cs::token_base*&>
                        ((tree_type<cs::token_base*> *)tree,iVar11,pptVar14);
              break;
            }
            iVar8 = get_signal_level(this,*pptVar14);
            pptVar12 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                                 (signals,__n);
            iVar9 = get_signal_level(this,*pptVar12);
            iVar11.mData = (tree_node *)local_d8._0_8_;
            if (iVar9 < iVar8) {
              pptVar14 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                                   (signals,__n);
              goto LAB_002b2891;
            }
            local_d8._0_8_ = tree_type<cs::token_base_*>::iterator::right((iterator *)local_d8);
          }
          __n = __n + 1;
        } while( true );
      }
    }
  }
  this_00 = (compile_error *)__cxa_allocate_exception(0x28);
  local_d8._0_8_ = &local_c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d8,"Unexpected grammar when building expression tree.","");
  compile_error::compile_error(this_00,(string *)local_d8);
  __cxa_throw(this_00,&compile_error::typeinfo,compile_error::~compile_error);
}

Assistant:

void compiler_type::build_tree(tree_type<token_base *> &tree, std::deque<token_base *> &signals,
	                               std::deque<token_base *> &objects)
	{
		if (objects.empty() || signals.empty() || objects.size() != signals.size() + 1)
			throw compile_error("Unexpected grammar when building expression tree.");
		for (auto &obj: objects) {
			if (obj != nullptr && obj->get_type() == token_types::sblist) {
				auto *sbl = static_cast<token_sblist *>(obj);
				std::deque<token_base *> tokens;
				for (auto &list: sbl->get_list()) {
					for (auto &it: list)
						tokens.push_back(it);
					tokens.push_back(new token_signal(signal_types::com_));
				}
				tokens.pop_back();
				tree_type<token_base *> t;
				gen_tree(t, tokens);
				obj = new token_expr(t);
			}
		}
		tree.clear();
		tree.emplace_root_left(tree.root(), signals.front());
		tree.emplace_left_left(tree.root(), objects.front());
		for (std::size_t i = 1; i < signals.size(); ++i) {
			for (typename tree_type<token_base *>::iterator it = tree.root(); it.usable(); it = it.right()) {
				if (!it.right().usable()) {
					tree.emplace_right_right(it, objects.at(i));
					break;
				}
			}
			for (typename tree_type<token_base *>::iterator it = tree.root(); it.usable(); it = it.right()) {
				if (!it.right().usable()) {
					tree.emplace_root_left(it, signals.at(i));
					break;
				}
				if (get_signal_level(it.data()) == get_signal_level(signals.at(i))) {
					if (is_left_associative(it.data()))
						tree.emplace_right_left(it, signals.at(i));
					else
						tree.emplace_root_left(it, signals.at(i));
					break;
				}
				if (get_signal_level(it.data()) > get_signal_level(signals.at(i))) {
					tree.emplace_root_left(it, signals.at(i));
					break;
				}
			}
		}
		for (typename tree_type<token_base *>::iterator it = tree.root(); it.usable(); it = it.right()) {
			if (!it.right().usable()) {
				tree.emplace_right_right(it, objects.back());
				break;
			}
		}
	}